

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::SurfaceAttribPixmapCase::executeForConfig
          (SurfaceAttribPixmapCase *this,EGLDisplay display,EGLConfig config)

{
  EGLDisplay *this_00;
  TestContext *pTVar1;
  Library *pLVar2;
  deUint32 err;
  Library *egl;
  NativePixmapFactory *pNVar3;
  EGLSurface surface_00;
  UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> pixmap;
  ConfigInfo local_248;
  UniqueSurface surface;
  
  egl = EglTestContext::getLibrary
                  ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                   m_eglTestCtx);
  pTVar1 = (this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
           super_TestNode.m_testCtx;
  pLVar2 = (Library *)pTVar1->m_log;
  pNVar3 = eglu::selectNativePixmapFactory
                     (((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                      m_eglTestCtx)->m_nativeDisplayFactory,pTVar1->m_cmdLine);
  local_248.transparentRedValue = 0;
  local_248.transparentGreenValue = 0;
  local_248.transparentBlueValue = 0;
  local_248.samples = 0;
  local_248.stencilSize = 0;
  local_248.surfaceType = 0;
  local_248.transparentType = 0;
  local_248.nativeVisualId = 0;
  local_248.nativeVisualType = 0;
  local_248.renderableType = 0;
  local_248.sampleBuffers = 0;
  local_248.maxPbufferHeight = 0;
  local_248.maxSwapInterval = 0;
  local_248.minSwapInterval = 0;
  local_248.nativeRenderable = 0;
  local_248.conformant = 0;
  local_248.depthSize = 0;
  local_248.level = 0;
  local_248.maxPbufferWidth = 0;
  local_248.bindToTextureRGBA = 0;
  local_248.colorBufferType = 0;
  local_248.configCaveat = 0;
  local_248.configId = 0;
  local_248.luminanceSize = 0;
  local_248.alphaSize = 0;
  local_248.alphaMaskSize = 0;
  local_248.bindToTextureRGB = 0;
  local_248.bufferSize = 0;
  local_248.redSize = 0;
  local_248.greenSize = 0;
  local_248.blueSize = 0;
  local_248.yuvOrder = 0x3038;
  local_248.yuvNumberOfPlanes = 0;
  local_248.yuvSubsample = 0x3038;
  local_248.yuvDepthRange = 0x3038;
  local_248.yuvCscStandard = 0x3038;
  local_248.yuvPlaneBpp = 0x331b;
  local_248.colorComponentType = 0x3038;
  eglu::queryCoreConfigInfo(egl,display,config,&local_248);
  this_00 = &surface.m_display;
  surface.m_egl = pLVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Creating pixmap surface with config ID ");
  std::ostream::operator<<(this_00,local_248.configId);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&surface,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  err = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(err,"before queries",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQuerySurfaceTests.cpp"
                   ,0x269);
  pixmap.super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.m_data.ptr =
       (NativePixmap *)
       (**(code **)(*(long *)pNVar3 + 0x20))
                 (pNVar3,(((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                          m_eglTestCtx)->m_nativeDisplay).
                         super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                         .m_data.ptr,display,config,0,0x40,0x40);
  surface_00 = eglu::createPixmapSurface
                         ((((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                           m_eglTestCtx)->m_nativeDisplay).
                          super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                          .m_data.ptr,
                          pixmap.
                          super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>
                          .m_data.ptr,display,config,(EGLAttrib *)0x0);
  eglu::UniqueSurface::UniqueSurface(&surface,egl,display,surface_00);
  SurfaceAttribCase::testAttributes
            (&this->super_SurfaceAttribCase,display,surface.m_surface,2,&local_248);
  eglu::UniqueSurface::~UniqueSurface(&surface);
  de::details::UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::~UniqueBase
            (&pixmap.super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>);
  return;
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&						egl				= m_eglTestCtx.getLibrary();
		tcu::TestLog&						log				= m_testCtx.getLog();
		const int							width			= 64;
		const int							height			= 64;
		const eglu::NativePixmapFactory&	pixmapFactory	= eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
		ConfigInfo							info;

		eglu::queryCoreConfigInfo(egl, display, config, &info);

		log << TestLog::Message << "Creating pixmap surface with config ID " << info.configId << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "before queries");

		de::UniquePtr<eglu::NativePixmap>	pixmap	(pixmapFactory.createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));
		eglu::UniqueSurface					surface	(egl, display, eglu::createPixmapSurface(m_eglTestCtx.getNativeDisplay(), *pixmap, display, config, DE_NULL));

		testAttributes(display, *surface, EGL_PIXMAP_BIT, info);
	}